

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_gk_svd_step<double>
               (int rows,int cols,double *mat_b,double *mat_q,double *mat_p,int p,int q,
               double *epsilon)

{
  long lVar1;
  double *mat_b_00;
  int iVar2;
  int givens_i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  double dVar9;
  int j;
  ulong uVar10;
  uint uVar11;
  pointer *givens_s_00;
  uint rows_a;
  double local_e8;
  double mat_c [4];
  double eig_1;
  double eig_2;
  double givens_c;
  vector<double,_std::allocator<double>_> buffer;
  double givens_s;
  double local_60;
  double alpha;
  double beta;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  local_38 = CONCAT44(local_38._4_4_,p);
  uVar11 = cols - q;
  rows_a = uVar11 - p;
  uVar4 = (ulong)(rows_a * rows_a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&givens_c,(ulong)(rows_a * rows_a * 3),
             (allocator_type *)&local_e8);
  mat_b_00 = (double *)((long)givens_c + uVar4 * 8);
  iVar2 = (int)local_38;
  lVar5 = (long)(int)local_38;
  beta = (double)(long)cols;
  uVar6 = 0;
  uVar3 = 0;
  if (0 < (int)rows_a) {
    uVar3 = (ulong)rows_a;
  }
  local_38._0_4_ = (cols + 1) * (int)local_38;
  dVar9 = givens_c;
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (uVar10 = 0; rows_a != uVar10; uVar10 = uVar10 + 1) {
      *(double *)((long)dVar9 + uVar10 * 8) = mat_b[(int)local_38 + (int)uVar10];
    }
    dVar9 = (double)((long)dVar9 + (long)(int)uVar11 * 8 + lVar5 * -8);
    local_38._0_4_ = (int)local_38 + cols;
  }
  pdVar7 = mat_b_00;
  for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    iVar8 = 0;
    for (uVar10 = 0; rows_a != uVar10; uVar10 = uVar10 + 1) {
      pdVar7[uVar10] = *(double *)((long)givens_c + uVar6 * 8 + (long)iVar8 * 8);
      iVar8 = iVar8 + rows_a;
    }
    pdVar7 = pdVar7 + ((int)uVar11 - lVar5);
  }
  pdVar7 = mat_b_00 + uVar4;
  local_44 = cols;
  local_40 = uVar4;
  local_38 = (ulong)uVar11;
  matrix_multiply<double>((double *)givens_c,rows_a,rows_a,mat_b_00,rows_a,pdVar7);
  iVar8 = (rows_a - 2) * rows_a;
  local_e8 = pdVar7[(int)(iVar8 + rows_a + -2)];
  mat_c[0] = pdVar7[(int)(iVar8 + -1 + rows_a)];
  iVar8 = (rows_a - 1) * rows_a;
  mat_c[1] = pdVar7[(int)(iVar8 + rows_a + -2)];
  mat_c[2] = pdVar7[(int)(iVar8 + -1 + rows_a)];
  matrix_2x2_eigenvalues<double>(&local_e8,mat_c + 3,&eig_1);
  uVar3 = -(ulong)(ABS(mat_c[2] - mat_c[3]) < ABS(mat_c[2] - eig_1));
  dVar9 = mat_b[iVar2 * local_44 + iVar2];
  local_60 = dVar9 * dVar9 - (double)(~uVar3 & (ulong)eig_1 | (ulong)mat_c[3] & uVar3);
  alpha = dVar9 * mat_b[iVar2 * local_44 + 1 + iVar2];
  iVar2 = (int)local_38;
  lVar1 = (long)beta + 1;
  local_38 = lVar1 * lVar5 + 2;
  beta = (double)((lVar5 + 1) * (long)beta + lVar5);
  while( true ) {
    iVar8 = local_44;
    givens_s_00 = &buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    if (iVar2 + -1 <= lVar5) break;
    matrix_givens_rotation<double>(&local_60,&alpha,&eig_2,(double *)givens_s_00,epsilon);
    givens_i = (int)lVar5;
    local_40 = CONCAT44(local_40._4_4_,givens_i + 1);
    matrix_apply_givens_column<double>
              (mat_b,iVar8,iVar8,givens_i,givens_i + 1,&eig_2,(double *)givens_s_00);
    matrix_apply_givens_column<double>
              (mat_p,iVar8,iVar8,givens_i,(int)local_40,&eig_2,(double *)givens_s_00);
    local_60 = mat_b[local_38 + -2];
    alpha = mat_b[(long)beta];
    matrix_givens_rotation<double>(&local_60,&alpha,&eig_2,(double *)givens_s_00,epsilon);
    matrix_apply_givens_row<double>
              (mat_b,iVar8,iVar8,givens_i,(int)local_40,&eig_2,(double *)givens_s_00);
    matrix_apply_givens_column<double>
              (mat_q,rows,iVar8,givens_i,(int)local_40,&eig_2,(double *)givens_s_00);
    if (lVar5 < iVar2 + -2) {
      local_60 = mat_b[local_38 + -1];
      alpha = mat_b[local_38];
    }
    local_38 = local_38 + lVar1;
    beta = (double)((long)beta + lVar1);
    lVar5 = lVar5 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&givens_c);
  return;
}

Assistant:

void
matrix_gk_svd_step (int rows, int cols, T* mat_b, T* mat_q, T* mat_p,
    int p, int q, T const& epsilon)
{
    int const slice_length = cols - q - p;
    int const mat_sizes = slice_length * slice_length;
    std::vector<T> buffer(3 * mat_sizes);
    T* mat_b22 = &buffer[0];
    T* mat_b22_t = mat_b22 + mat_sizes;
    T* mat_tmp = mat_b22_t + mat_sizes;

    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22[i * slice_length + j] = mat_b[(p + i) *  cols + (p + j)];
    for (int i = 0; i < slice_length; ++i)
        for (int j = 0; j < slice_length; ++j)
            mat_b22_t[i * slice_length + j] = mat_b22[j * slice_length + i];

    /* Slice outer product gives covariance matrix. */
    matrix_multiply(mat_b22, slice_length, slice_length, mat_b22_t,
        slice_length, mat_tmp);

    T mat_c[2 * 2];
    mat_c[0] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 2)];
    mat_c[1] = mat_tmp[(slice_length - 2) * slice_length + (slice_length - 1)];
    mat_c[2] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 2)];
    mat_c[3] = mat_tmp[(slice_length - 1) * slice_length + (slice_length - 1)];

    /* Use eigenvalue that is closer to the lower right entry of the slice. */
    T eig_1, eig_2;
    matrix_2x2_eigenvalues(mat_c, &eig_1, &eig_2);

    T diff1 = std::abs(mat_c[3] - eig_1);
    T diff2 = std::abs(mat_c[3] - eig_2);
    T mu = (diff1 < diff2) ? eig_1 : eig_2;

    /* Zero another entry bz applyting givens rotations. */
    int k = p;
    T alpha = mat_b[k * cols + k] * mat_b[k * cols + k] - mu;
    T beta = mat_b[k * cols + k] * mat_b[k * cols + (k + 1)];

    for (int k = p; k < cols - q - 1; ++k)
    {
        T givens_c, givens_s;
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        matrix_apply_givens_column(mat_b, cols, cols, k, k + 1, givens_c,
            givens_s);
        matrix_apply_givens_column(mat_p, cols, cols, k, k + 1, givens_c,
            givens_s);

        alpha = mat_b[k * cols + k];
        beta = mat_b[(k + 1) * cols + k];
        matrix_givens_rotation(alpha, beta, &givens_c, &givens_s, epsilon);
        internal::matrix_apply_givens_row(mat_b, cols, cols, k, k + 1,
            givens_c, givens_s);
        internal::matrix_apply_givens_column(mat_q, rows, cols, k, k + 1,
            givens_c, givens_s);

        if (k < (cols - q - 2))
        {
            alpha = mat_b[k * cols + (k + 1)];
            beta = mat_b[k * cols + (k + 2)];
        }
    }
}